

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O3

void nhdp_domain_init_l2hop(nhdp_l2hop *l2hop)

{
  int iVar1;
  long lVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&l2hop->_domaindata[0].metric.in + lVar2) = 0xffffff00ffffff;
    lVar2 = lVar2 + 0xc;
    plVar3 = _domain_list.next;
    plVar4 = _domain_list.prev;
  } while (lVar2 != 0x30);
  for (; plVar3->prev != plVar4; plVar3 = plVar3->next) {
    if (*(char *)&plVar3[-0x28].next[2].next == '\x01') {
      iVar1 = *(int *)((long)&plVar3[-0x27].next + 4);
      l2hop->_domaindata[iVar1].metric.in = *(uint32_t *)&plVar3[-0x28].next[1].prev;
      l2hop->_domaindata[iVar1].metric.out = *(uint32_t *)((long)&plVar3[-0x28].next[1].prev + 4);
      plVar4 = _domain_list.prev;
    }
  }
  return;
}

Assistant:

void
nhdp_domain_init_l2hop(struct nhdp_l2hop *l2hop) {
  struct nhdp_domain *domain;
  struct nhdp_l2hop_domaindata *data;
  int i;

  /* initialize metrics */
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    l2hop->_domaindata[i].metric.in = RFC7181_METRIC_INFINITE;
    l2hop->_domaindata[i].metric.out = RFC7181_METRIC_INFINITE;
  }

  list_for_each_element(&_domain_list, domain, _node) {
    data = nhdp_domain_get_l2hopdata(domain, l2hop);

    if (domain->metric->no_default_handling) {
      data->metric.in = domain->metric->incoming_2hop_start;
      data->metric.out = domain->metric->outgoing_2hop_start;
    }
  }
}